

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTHumidityHTS221.cpp
# Opt level: O2

bool __thiscall RTHumidityHTS221::humidityInit(RTHumidityHTS221 *this)

{
  uchar uVar1;
  RTIMUSettings *this_00;
  uchar uVar2;
  uchar auVar3 [2];
  uchar uVar4;
  uchar uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  uchar rawData [2];
  uint8_t H1_H_2;
  uint8_t H0_H_2;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  
  H0_H_2 = '\0';
  H1_H_2 = '\0';
  this_00 = (this->super_RTHumidity).m_settings;
  uVar1 = this_00->m_I2CHumidityAddress;
  this->m_humidityAddr = uVar1;
  bVar6 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,uVar1,' ',0x87,
                             "Failed to set HTS221 CTRL_REG_1");
  if ((((bVar6) &&
       (bVar6 = RTIMUHal::HALWrite(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                   this->m_humidityAddr,'\x10','\x1b',"Failed to set HTS221 AV_CONF"
                                  ), bVar6)) &&
      (bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                 this->m_humidityAddr,0xb5,'\x01',rawData + 1,
                                 "Failed to read HTS221 T1_T0"), bVar6)) &&
     (bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                this->m_humidityAddr,0xb2,'\x01',rawData,
                                "Failed to read HTS221 T0_C_8"), bVar6)) {
    uVar4 = rawData[1];
    uVar1 = rawData[0];
    bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                              this->m_humidityAddr,0xb3,'\x01',rawData,
                              "Failed to read HTS221 T1_C_8");
    if (bVar6) {
      uVar5 = rawData[1];
      uVar2 = rawData[0];
      bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                this->m_humidityAddr,0xbc,'\x02',rawData,
                                "Failed to read HTS221 T0_OUT");
      auVar3 = rawData;
      if (bVar6) {
        local_34 = (uint)rawData[0];
        bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                  this->m_humidityAddr,0xbe,'\x02',rawData,
                                  "Failed to read HTS221 T1_OUT");
        if (bVar6) {
          local_38 = (int)(short)rawData;
          bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                    this->m_humidityAddr,0xb0,'\x01',&H0_H_2,
                                    "Failed to read HTS221 H0_H_2");
          if (bVar6) {
            local_3c = (uint)H0_H_2;
            bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                      this->m_humidityAddr,0xb1,'\x01',&H1_H_2,
                                      "Failed to read HTS221 H1_H_2");
            if (bVar6) {
              local_40 = (uint)H1_H_2;
              bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                        this->m_humidityAddr,0xb6,'\x02',rawData,
                                        "Failed to read HTS221 H0_T_OUT");
              if (bVar6) {
                local_48 = (uint)rawData[1];
                local_44 = (uint)rawData[0];
                bVar6 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                                          this->m_humidityAddr,0xba,'\x02',rawData,
                                          "Failed to read HTS221 H1_T_OUT");
                if (bVar6) {
                  fVar9 = (float)((uVar4 & 3) << 8 | (uint)uVar1) * 0.125;
                  iVar7 = (int)(short)((ushort)auVar3 & 0xff00) + local_34;
                  iVar8 = (int)(short)((short)local_48 << 8) + local_44;
                  fVar10 = ((float)((uVar5 & 0xc) << 6 | (uint)uVar2) * 0.125 - fVar9) /
                           (float)(local_38 - iVar7);
                  this->m_temperature_m = fVar10;
                  this->m_temperature_c = fVar9 - (float)(int)(short)iVar7 * fVar10;
                  fVar9 = ((float)(int)local_40 * 0.5 - (float)(int)local_3c * 0.5) /
                          (float)((short)rawData - iVar8);
                  this->m_humidity_m = fVar9;
                  this->m_humidity_c = (float)(int)local_3c * 0.5 - (float)iVar8 * fVar9;
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool RTHumidityHTS221::humidityInit()
{
    unsigned char rawData[2];
    uint8_t H0_H_2 = 0;
    uint8_t H1_H_2 = 0;
    uint16_t T0_C_8 = 0;
    uint16_t T1_C_8 = 0;
    int16_t H0_T0_OUT = 0;
    int16_t H1_T0_OUT = 0;
    int16_t T0_OUT = 0;
    int16_t T1_OUT = 0;
    float H0, H1, T0, T1;

    m_humidityAddr = m_settings->m_I2CHumidityAddress;

    if (!m_settings->HALWrite(m_humidityAddr, HTS221_CTRL1, 0x87, "Failed to set HTS221 CTRL_REG_1"))
        return false;

    if (!m_settings->HALWrite(m_humidityAddr, HTS221_AV_CONF, 0x1b, "Failed to set HTS221 AV_CONF"))
        return false;

    // Get calibration data

    if (!m_settings->HALRead(m_humidityAddr, HTS221_T1_T0 + 0x80, 1, &rawData[1], "Failed to read HTS221 T1_T0"))
        return false;
    if (!m_settings->HALRead(m_humidityAddr, HTS221_T0_C_8 + 0x80, 1, rawData, "Failed to read HTS221 T0_C_8"))
        return false;
    T0_C_8 = (((unsigned int)rawData[1] & 0x3 ) << 8) | (unsigned int)rawData[0];
    T0 = (RTFLOAT)T0_C_8 / 8;

    if (!m_settings->HALRead(m_humidityAddr, HTS221_T1_C_8 + 0x80, 1, rawData, "Failed to read HTS221 T1_C_8"))
        return false;
    T1_C_8 = (unsigned int)(((uint16_t)(rawData[1] & 0xC) << 6) | (uint16_t)rawData[0]);
    T1 = (RTFLOAT)T1_C_8 / 8;

    if (!m_settings->HALRead(m_humidityAddr, HTS221_T0_OUT + 0x80, 2, rawData, "Failed to read HTS221 T0_OUT"))
        return false;
    T0_OUT = (int16_t)(((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0];

    if (!m_settings->HALRead(m_humidityAddr, HTS221_T1_OUT + 0x80, 2, rawData, "Failed to read HTS221 T1_OUT"))
        return false;
    T1_OUT = (int16_t)(((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0];

    if (!m_settings->HALRead(m_humidityAddr, HTS221_H0_H_2 + 0x80, 1, &H0_H_2, "Failed to read HTS221 H0_H_2"))
        return false;
    H0 = (RTFLOAT)H0_H_2 / 2;

    if (!m_settings->HALRead(m_humidityAddr, HTS221_H1_H_2 + 0x80, 1, &H1_H_2, "Failed to read HTS221 H1_H_2"))
        return false;
    H1 = (RTFLOAT)H1_H_2 / 2;

    if (!m_settings->HALRead(m_humidityAddr, HTS221_H0_T0_OUT + 0x80, 2, rawData, "Failed to read HTS221 H0_T_OUT"))
        return false;
    H0_T0_OUT = (int16_t)(((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0];


    if (!m_settings->HALRead(m_humidityAddr, HTS221_H1_T0_OUT + 0x80, 2, rawData, "Failed to read HTS221 H1_T_OUT"))
        return false;
    H1_T0_OUT = (int16_t)(((unsigned int)rawData[1]) << 8) | (unsigned int)rawData[0];

    m_temperature_m = (T1-T0)/(T1_OUT-T0_OUT);
    m_temperature_c = T0-(m_temperature_m*T0_OUT);
    m_humidity_m = (H1-H0)/(H1_T0_OUT-H0_T0_OUT);
    m_humidity_c = (H0)-(m_humidity_m*H0_T0_OUT);

    return true;
}